

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ATN.hpp
# Opt level: O0

void __thiscall Centaurus::ATNNode<wchar_t>::ATNNode(ATNNode<wchar_t> *this,Stream *stream)

{
  Stream *stream_local;
  ATNNode<wchar_t> *this_local;
  
  this->_vptr_ATNNode = (_func_int **)&PTR__ATNNode_0028c880;
  std::
  vector<Centaurus::ATNTransition<wchar_t>,_std::allocator<Centaurus::ATNTransition<wchar_t>_>_>::
  vector(&this->m_transitions);
  Identifier::Identifier(&this->m_invoke);
  NFA<wchar_t>::NFA(&this->m_nfa);
  std::__cxx11::wstring::wstring((wstring *)&this->m_literal);
  parse(this,stream);
  return;
}

Assistant:

ATNNode(Stream& stream)
    {
        parse(stream);
    }